

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

int archive_read_format_7zip_read_header(archive_read *a,archive_entry *entry)

{
  uint32_t **ppuVar1;
  _7z_stream_info *si;
  size_t *psVar2;
  _7z_folder *p_Var3;
  long lVar4;
  void *pvVar5;
  uint64_t uVar6;
  size_t sVar7;
  size_t sVar8;
  wchar_t wVar9;
  int iVar10;
  uint32_t *puVar11;
  archive_string_conv *paVar12;
  int *piVar13;
  char *pcVar14;
  char *pcVar15;
  ulong uVar16;
  int64_t iVar17;
  uchar *puVar18;
  int unaff_EBX;
  uint uVar19;
  ulong uVar20;
  uint64_t *puVar21;
  long lVar22;
  char *pcVar23;
  bool bVar24;
  int64_t offset;
  size_t size;
  _7z_header_info header;
  long local_78;
  size_t local_70;
  long local_68;
  archive_read *local_60;
  _7z_header_info local_58;
  
  si = (_7z_stream_info *)a->format->data;
  if ((int)si[0xc6].ci.numFolders == -1) {
    *(undefined4 *)&si[0xc6].ci.numFolders = 0;
  }
  (a->archive).archive_format = 0xe0000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "7-Zip";
  }
  if (si[1].ci.folders == (_7z_folder *)0x0) {
    local_58.emptyFileBools = (uchar *)0x0;
    local_58.antiBools = (uchar *)0x0;
    local_58.dataIndex = 0;
    local_58.emptyStreamBools = (uchar *)0x0;
    local_58.attrBools = (uchar *)0x0;
    piVar13 = (int *)__archive_read_ahead(a,0x20,&local_78);
    if (piVar13 == (int *)0x0) {
LAB_001f813d:
      iVar10 = -0x1e;
    }
    else {
      if ((((char)*piVar13 != 'M') || (*(char *)((long)piVar13 + 1) != 'Z')) &&
         (*piVar13 != 0x464c457f)) {
LAB_001f806f:
        ppuVar1 = &si[1].pi.digest.digests;
        *ppuVar1 = *ppuVar1 + 8;
        if ((short)piVar13[1] == 0x1c27 && *piVar13 == -0x504385c9) {
          uVar20 = crc32(0,piVar13 + 3,0x14);
          if (uVar20 == (uint)piVar13[2]) {
            uVar6 = *(uint64_t *)(piVar13 + 5);
            if (uVar6 == 0) {
              iVar10 = 1;
              goto LAB_001f8146;
            }
            if ((long)((ulong)(uint)piVar13[4] << 0x20) < 0) {
              pcVar14 = "Malformed 7-Zip archive";
              goto LAB_001f812e;
            }
            puVar21 = (uint64_t *)CONCAT44(piVar13[4],piVar13[3]);
            uVar19 = piVar13[7];
            __archive_read_consume(a,0x20);
            if (puVar21 == (uint64_t *)0x0) {
LAB_001f8245:
              si[2].pi.positions = puVar21;
              si[1].pi.digest.defineds = (uchar *)puVar21;
              si[1].pi.numPackStreams = uVar6;
              si[1].pi.sizes = (uint64_t *)0x0;
              si[1].pi.pos = 1;
              *(undefined4 *)&si[0xc6].ci.numFolders = 0;
              puVar18 = header_bytes(a,1);
              if (puVar18 == (uchar *)0x0) {
                archive_set_error(&a->archive,0x54,"Truncated 7-Zip file body");
              }
              else {
                if (*puVar18 != '\x01') {
                  if (*puVar18 == '\x17') {
                    iVar10 = decode_encoded_header_info(a,si);
                    if ((iVar10 == 0) && (iVar10 = 0, si[1].pi.sizes != (uint64_t *)(ulong)uVar19))
                    {
                      iVar10 = -1;
                      archive_set_error(&a->archive,-1,"Damaged 7-Zip archive");
                    }
                    bVar24 = true;
                    if (iVar10 == 0) {
                      p_Var3 = (si->ci).folders;
                      bVar24 = p_Var3->digest_defined != '\0';
                      if (bVar24) {
                        uVar19 = p_Var3->digest;
                      }
                      if (si[2].ss.unpackSizes != (uint64_t *)0x0) {
                        read_consume(a);
                      }
                      iVar10 = setup_decode_folder(a,(si->ci).folders,1);
                      if (iVar10 == 0) {
                        si[1].pi.numPackStreams = (uint64_t)si[2].ci.folders;
                        iVar10 = seek_pack(a);
                      }
                    }
                    free_StreamsInfo(si);
                    (si->ss).unpackSizes = (uint64_t *)0x0;
                    (si->ss).digestsDefined = (uchar *)0x0;
                    (si->ci).dataStreamIndex = 0;
                    (si->ss).unpack_streams = 0;
                    (si->ci).numFolders = 0;
                    (si->ci).folders = (_7z_folder *)0x0;
                    (si->pi).digest.digests = (uint32_t *)0x0;
                    (si->pi).positions = (uint64_t *)0x0;
                    (si->pi).sizes = (uint64_t *)0x0;
                    (si->pi).digest.defineds = (uchar *)0x0;
                    (si->pi).pos = 0;
                    (si->pi).numPackStreams = 0;
                    (si->ss).digests = (uint32_t *)0x0;
                    if (iVar10 < 0) goto LAB_001f8463;
                    *(undefined4 *)((long)&si[1].pi.pos + 4) = 1;
                    si[1].pi.sizes = (uint64_t *)0x0;
                    bVar24 = !bVar24;
                    goto LAB_001f83d9;
                  }
                  archive_set_error(&a->archive,-1,"Unexpected Property ID = %X");
LAB_001f832e:
                  iVar10 = -0x1e;
                  goto LAB_001f8146;
                }
                bVar24 = false;
LAB_001f83d9:
                piVar13 = __errno_location();
                *piVar13 = 0;
                iVar10 = read_Header(a,&local_58,*(int *)((long)&si[1].pi.pos + 4));
                if (iVar10 < 0) {
                  if (*piVar13 == 0xc) {
                    pcVar14 = "Couldn\'t allocate memory";
                  }
                  else {
                    pcVar14 = "Damaged 7-Zip archive";
                  }
                }
                else {
                  puVar18 = header_bytes(a,1);
                  if ((puVar18 != (uchar *)0x0) && (*puVar18 == '\0')) {
                    if ((bVar24) || (si[1].pi.sizes == (uint64_t *)(ulong)uVar19)) {
                      si[2].pi.digest.digests = (uint32_t *)0x0;
                      si[2].ss.unpackSizes = (uint64_t *)0x0;
                      *(undefined4 *)&si[1].pi.pos = 0;
                      si[2].ci.folders = (_7z_folder *)0x0;
                      si[2].ci.dataStreamIndex = 0;
                      iVar10 = 0;
                      goto LAB_001f8146;
                    }
                    archive_set_error(&a->archive,-1,"Malformed 7-Zip archive");
                    goto LAB_001f832e;
                  }
                  pcVar14 = "Malformed 7-Zip archive";
                }
                archive_set_error(&a->archive,-1,pcVar14);
              }
            }
            else {
              if ((long)puVar21 <= local_78) {
                __archive_read_consume(a,(int64_t)puVar21);
                goto LAB_001f8245;
              }
              iVar17 = __archive_read_seek(a,(long)si[1].pi.digest.digests + (long)puVar21,0);
              if (-1 < iVar17) goto LAB_001f8245;
            }
LAB_001f8463:
            iVar10 = -0x1e;
            goto LAB_001f8146;
          }
          pcVar14 = "Header CRC error";
        }
        else {
          pcVar14 = "Not 7-Zip archive file";
        }
LAB_001f812e:
        archive_set_error(&a->archive,-1,pcVar14);
        goto LAB_001f813d;
      }
      if (local_78 < 0x27001) {
        iVar17 = __archive_read_seek(a,0x27000,0);
        if (-1 < iVar17) goto LAB_001f7f0d;
      }
      else {
        __archive_read_consume(a,0x27000);
LAB_001f7f0d:
        lVar22 = 0;
        uVar20 = 1;
        do {
          while (pcVar14 = (char *)__archive_read_ahead(a,uVar20,(ssize_t *)&local_70),
                pcVar14 == (char *)0x0) {
            if (uVar20 < 0x80) goto LAB_001f8028;
            uVar16 = uVar20 >> 1;
LAB_001f7fd7:
            uVar20 = uVar16;
            if (0x39000 < uVar16 + lVar22) goto LAB_001f8028;
          }
          uVar16 = 0x1000;
          if ((long)local_70 < 6) goto LAB_001f7fd7;
          pcVar23 = pcVar14 + local_70;
          local_68 = lVar22;
          local_60 = a;
          for (pcVar15 = pcVar14; pcVar15 + 0x20 < pcVar23; pcVar15 = pcVar15 + uVar19) {
            uVar19 = check_7zip_header_in_sfx(pcVar15);
            if (uVar19 == 0) {
              pvVar5 = a->format->data;
              __archive_read_consume(local_60,(long)pcVar15 - (long)pcVar14);
              *(long *)((long)pvVar5 + 0x88) = ((long)pcVar15 - (long)pcVar14) + lVar22 + 0x27000;
              bVar24 = false;
              iVar10 = 0;
              a = local_60;
              goto LAB_001f8045;
            }
          }
          __archive_read_consume(a,(long)pcVar15 - (long)pcVar14);
          lVar22 = local_68 + ((long)pcVar15 - (long)pcVar14);
          if (uVar20 == 1) {
            uVar20 = 0x1000;
          }
        } while (lVar22 + uVar20 < 0x39001);
LAB_001f8028:
        archive_set_error(&a->archive,0x54,"Couldn\'t find out 7-Zip header");
      }
      iVar10 = -0x1e;
      bVar24 = true;
LAB_001f8045:
      if (!bVar24) {
        piVar13 = (int *)__archive_read_ahead(a,0x20,&local_78);
        if (piVar13 == (int *)0x0) goto LAB_001f813d;
        goto LAB_001f806f;
      }
    }
LAB_001f8146:
    free(local_58.emptyStreamBools);
    free(local_58.emptyFileBools);
    free(local_58.antiBools);
    free(local_58.attrBools);
    if (iVar10 != 0) {
      return iVar10;
    }
    p_Var3 = si[1].ci.folders;
    si[1].pi.positions = (uint64_t *)si[1].ci.numFolders;
    si[1].ci.dataStreamIndex = (uint64_t)p_Var3;
    unaff_EBX = 0;
  }
  else {
    puVar21 = &si[1].ci.dataStreamIndex;
    *puVar21 = *puVar21 + 0x58;
  }
  puVar21 = si[1].pi.positions;
  if (puVar21 == (uint64_t *)0x0) {
    return 1;
  }
  psVar2 = (size_t *)si[1].ci.dataStreamIndex;
  si[1].pi.positions = (uint64_t *)((long)puVar21 + -1);
  si[1].ss.unpackSizes = (uint64_t *)0x0;
  *(undefined1 *)&si[2].pi.pos = 0;
  puVar11 = (uint32_t *)crc32(0,0,0);
  si[1].ss.digests = puVar11;
  if (si[0xc5].ss.unpackSizes == (uint64_t *)0x0) {
    paVar12 = archive_string_conversion_from_charset(&a->archive,"UTF-16LE",L'\x01');
    si[0xc5].ss.unpackSizes = (uint64_t *)paVar12;
    if (paVar12 != (archive_string_conv *)0x0) goto LAB_001f7bcb;
LAB_001f7cb3:
    iVar10 = -0x1e;
  }
  else {
LAB_001f7bcb:
    if (((psVar2 != (size_t *)0x0) && (sVar7 = psVar2[2], (ulong)(uint)sVar7 < (si->ci).numFolders))
       && (p_Var3 = (si->ci).folders, p_Var3 != (_7z_folder *)0x0)) {
      uVar20 = 0xffffffffffffffff;
      lVar22 = 0;
      do {
        uVar20 = uVar20 + 1;
        if (p_Var3[(uint)sVar7].numCoders <= uVar20) break;
        lVar4 = *(long *)((long)&(p_Var3[(uint)sVar7].coders)->codec + lVar22);
        if (((lVar4 == 0x6f10101) || (lVar4 == 0x6f10701)) || (lVar4 == 0x6f10303)) {
          archive_entry_set_is_data_encrypted(entry,'\x01');
          *(undefined4 *)&si[0xc6].ci.numFolders = 1;
        }
        lVar22 = lVar22 + 0x28;
      } while (p_Var3 != (_7z_folder *)0x0);
    }
    if ((int)si[0xc6].ci.numFolders == -1) {
      *(undefined4 *)&si[0xc6].ci.numFolders = 0;
    }
    wVar9 = _archive_entry_copy_pathname_l
                      (entry,(char *)psVar2[1],*psVar2,
                       (archive_string_conv *)si[0xc5].ss.unpackSizes);
    if (wVar9 == L'\0') {
      iVar10 = 0;
    }
    else {
      piVar13 = __errno_location();
      if (*piVar13 == 0xc) {
        archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Pathname");
        goto LAB_001f7cb3;
      }
      pcVar14 = archive_string_conversion_charset_name
                          ((archive_string_conv *)si[0xc5].ss.unpackSizes);
      archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to current locale.",
                        pcVar14);
      iVar10 = -0x14;
    }
    archive_entry_set_mode(entry,(mode_t)psVar2[10]);
    if ((psVar2[3] & 1) != 0) {
      archive_entry_set_mtime(entry,psVar2[4],psVar2[7]);
    }
    if ((psVar2[3] & 4) != 0) {
      archive_entry_set_ctime(entry,psVar2[6],psVar2[9]);
    }
    if ((psVar2[3] & 2) != 0) {
      archive_entry_set_atime(entry,psVar2[5],psVar2[8]);
    }
    if ((ulong)*(uint *)((long)psVar2 + 0x14) == 0xffffffff) {
      puVar18 = (uchar *)0x0;
    }
    else {
      puVar18 = (uchar *)(si->ss).unpackSizes[*(uint *)((long)psVar2 + 0x14)];
    }
    si[1].ss.digestsDefined = puVar18;
    archive_entry_set_size(entry,(int64_t)puVar18);
    if (si[1].ss.digestsDefined == (uchar *)0x0) {
      *(undefined1 *)&si[2].pi.pos = 1;
    }
    if ((psVar2[10] & 0xf000) == 0xa000) {
      local_68 = CONCAT44(local_68._4_4_,iVar10);
      lVar22 = 0;
      pcVar14 = (char *)0x0;
      do {
        puVar18 = si[1].ss.digestsDefined;
        if (puVar18 == (uchar *)0x0) {
          if (lVar22 == 0) {
            uVar19 = (uint)psVar2[10] & 0xffff0fff | 0x8000;
            *(uint *)(psVar2 + 10) = uVar19;
            archive_entry_set_mode(entry,uVar19);
          }
          else {
            pcVar14[lVar22] = '\0';
            archive_entry_copy_symlink(entry,pcVar14);
          }
          free(pcVar14);
          archive_entry_set_size(entry,0);
          break;
        }
        iVar10 = archive_read_format_7zip_read_data(a,(void **)&local_58,&local_70,&local_78);
        if (iVar10 < -0x14) {
          free(pcVar14);
LAB_001f7ebf:
          bVar24 = false;
          pcVar15 = pcVar14;
          unaff_EBX = iVar10;
        }
        else {
          pcVar15 = (char *)realloc(pcVar14,lVar22 + local_70 + 1);
          sVar8 = local_70;
          if (pcVar15 == (char *)0x0) {
            free(pcVar14);
            archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Symname");
            iVar10 = -0x1e;
            goto LAB_001f7ebf;
          }
          memcpy(pcVar15 + lVar22,(void *)local_58.dataIndex,local_70);
          lVar22 = lVar22 + sVar8;
          bVar24 = true;
        }
        pcVar14 = pcVar15;
      } while (bVar24);
      iVar10 = (int)local_68;
      if (puVar18 != (uchar *)0x0) {
        return unaff_EBX;
      }
    }
    *(undefined2 *)((long)&si[0xc5].ss.digestsDefined + 4) = 0x70;
    *(undefined4 *)&si[0xc5].ss.digestsDefined = 0x695a2d37;
    (a->archive).archive_format_name = (char *)&si[0xc5].ss.digestsDefined;
  }
  return iVar10;
}

Assistant:

static int
archive_read_format_7zip_read_header(struct archive_read *a,
	struct archive_entry *entry)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	struct _7zip_entry *zip_entry;
	int r, ret = ARCHIVE_OK;
	struct _7z_folder *folder = 0;
	uint64_t fidx = 0;

	/*
	 * It should be sufficient to call archive_read_next_header() for
	 * a reader to determine if an entry is encrypted or not. If the
	 * encryption of an entry is only detectable when calling
	 * archive_read_data(), so be it. We'll do the same check there
	 * as well.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	a->archive.archive_format = ARCHIVE_FORMAT_7ZIP;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "7-Zip";

	if (zip->entries == NULL) {
		struct _7z_header_info header;

		memset(&header, 0, sizeof(header));
		r = slurp_central_directory(a, zip, &header);
		free_Header(&header);
		if (r != ARCHIVE_OK)
			return (r);
		zip->entries_remaining = (size_t)zip->numFiles;
		zip->entry = zip->entries;
	} else {
		++zip->entry;
	}
	zip_entry = zip->entry;

	if (zip->entries_remaining <= 0)
		return ARCHIVE_EOF;
	--zip->entries_remaining;

	zip->entry_offset = 0;
	zip->end_of_entry = 0;
	zip->entry_crc32 = crc32(0, NULL, 0);

	/* Setup a string conversion for a filename. */
	if (zip->sconv == NULL) {
		zip->sconv = archive_string_conversion_from_charset(
		    &a->archive, "UTF-16LE", 1);
		if (zip->sconv == NULL)
			return (ARCHIVE_FATAL);
	}

	/* Figure out if the entry is encrypted by looking at the folder
	   that is associated to the current 7zip entry. If the folder
	   has a coder with a _7Z_CRYPTO codec then the folder is encrypted.
	   Hence the entry must also be encrypted. */
	if (zip_entry && zip_entry->folderIndex < zip->si.ci.numFolders) {
		folder = &(zip->si.ci.folders[zip_entry->folderIndex]);
		for (fidx=0; folder && fidx<folder->numCoders; fidx++) {
			switch(folder->coders[fidx].codec) {
				case _7Z_CRYPTO_MAIN_ZIP:
				case _7Z_CRYPTO_RAR_29:
				case _7Z_CRYPTO_AES_256_SHA_256: {
					archive_entry_set_is_data_encrypted(entry, 1);
					zip->has_encrypted_entries = 1;
					break;
				}
			}
		}
	}

	/* Now that we've checked for encryption, if there were still no
	 * encrypted entries found we can say for sure that there are none.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	if (archive_entry_copy_pathname_l(entry,
	    (const char *)zip_entry->utf16name,
	    zip_entry->name_len, zip->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname cannot be converted "
		    "from %s to current locale.",
		    archive_string_conversion_charset_name(zip->sconv));
		ret = ARCHIVE_WARN;
	}

	/* Populate some additional entry fields: */
	archive_entry_set_mode(entry, zip_entry->mode);
	if (zip_entry->flg & MTIME_IS_SET)
		archive_entry_set_mtime(entry, zip_entry->mtime,
			zip_entry->mtime_ns);
	if (zip_entry->flg & CTIME_IS_SET)
		archive_entry_set_ctime(entry, zip_entry->ctime,
		    zip_entry->ctime_ns);
	if (zip_entry->flg & ATIME_IS_SET)
		archive_entry_set_atime(entry, zip_entry->atime,
		    zip_entry->atime_ns);
	if (zip_entry->ssIndex != (uint32_t)-1) {
		zip->entry_bytes_remaining =
		    zip->si.ss.unpackSizes[zip_entry->ssIndex];
		archive_entry_set_size(entry, zip->entry_bytes_remaining);
	} else {
		zip->entry_bytes_remaining = 0;
		archive_entry_set_size(entry, 0);
	}

	/* If there's no body, force read_data() to return EOF immediately. */
	if (zip->entry_bytes_remaining < 1)
		zip->end_of_entry = 1;

	if ((zip_entry->mode & AE_IFMT) == AE_IFLNK) {
		unsigned char *symname = NULL;
		size_t symsize = 0;

		/*
		 * Symbolic-name is recorded as its contents. We have to
		 * read the contents at this time.
		 */
		while (zip->entry_bytes_remaining > 0) {
			const void *buff;
			unsigned char *mem;
			size_t size;
			int64_t offset;

			r = archive_read_format_7zip_read_data(a, &buff,
				&size, &offset);
			if (r < ARCHIVE_WARN) {
				free(symname);
				return (r);
			}
			mem = realloc(symname, symsize + size + 1);
			if (mem == NULL) {
				free(symname);
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Symname");
				return (ARCHIVE_FATAL);
			}
			symname = mem;
			memcpy(symname+symsize, buff, size);
			symsize += size;
		}
		if (symsize == 0) {
			/* If there is no synname, handle it as a regular
			 * file. */
			zip_entry->mode &= ~AE_IFMT;
			zip_entry->mode |= AE_IFREG;
			archive_entry_set_mode(entry, zip_entry->mode);
		} else {
			symname[symsize] = '\0';
			archive_entry_copy_symlink(entry,
			    (const char *)symname);
		}
		free(symname);
		archive_entry_set_size(entry, 0);
	}

	/* Set up a more descriptive format name. */
	sprintf(zip->format_name, "7-Zip");
	a->archive.archive_format_name = zip->format_name;

	return (ret);
}